

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_platform_sdl2.c
# Opt level: O3

void FAudio_UTF8_To_UTF16(char *src,uint16_t *dst,size_t len)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  byte *pbVar4;
  ushort uVar5;
  uint uVar6;
  int iVar7;
  
  uVar2 = len - 2;
  while (uVar3 = uVar2, 1 < uVar3) {
    bVar1 = *src;
    uVar6 = (uint)bVar1;
    if (bVar1 == 0) break;
    if ((char)bVar1 < '\0') {
      if (bVar1 < 0xc0) {
        pbVar4 = (byte *)src + 1;
        uVar5 = 0x3f;
      }
      else if (bVar1 < 0xe0) {
        bVar1 = ((byte *)src)[1];
        uVar5 = 0x3f;
        if ((bVar1 & 0xffffffc0) == 0x80) {
          pbVar4 = (byte *)src + 2;
          if ((uVar6 * 0x40 + (uint)bVar1) - 0x3100 < 0x780) {
            uVar6 = (uVar6 * 0x40 + (uint)bVar1) - 0x3080;
            goto LAB_0011cfbe;
          }
        }
        else {
          pbVar4 = (byte *)src + 1;
        }
      }
      else if (bVar1 < 0xf0) {
        pbVar4 = (byte *)src + 1;
        uVar5 = 0x3f;
        if (((((byte *)src)[1] & 0xc0) == 0x80) && ((((byte *)src)[2] & 0xffffffc0) == 0x80)) {
          pbVar4 = (byte *)src + 3;
          uVar6 = (uint)((byte *)src)[1] * 0x40 + uVar6 * 0x1000 + (uint)((byte *)src)[2];
          if (uVar6 < 0xefc7f) {
            if ((1 < uVar6 - 0xefbff) && (uVar6 != 0xef880)) goto LAB_0011d27c;
          }
          else if ((1 < uVar6 - 0xefc7f) && ((uVar6 != 0xf0000 && (uVar6 != 0xf007f)))) {
LAB_0011d27c:
            if (uVar6 - 0xe2880 < 0xf7fe) {
              uVar6 = uVar6 - 0xe2080;
              goto LAB_0011cfbe;
            }
          }
        }
      }
      else if (bVar1 < 0xf8) {
        pbVar4 = (byte *)src + 1;
        uVar5 = 0x3f;
        if ((((((byte *)src)[1] & 0xc0) == 0x80) && ((((byte *)src)[2] & 0xc0) == 0x80)) &&
           (bVar1 = ((byte *)src)[3], (bVar1 & 0xc0) == 0x80)) {
          pbVar4 = (byte *)src + 4;
          iVar7 = (uint)((byte *)src)[2] * 0x40 + (uint)((byte *)src)[1] * 0x1000 + uVar6 * 0x40000;
          if ((uint)bVar1 + iVar7 + 0xfc36df80 < 0x100000) {
            uVar6 = (uint)bVar1 + iVar7 + 0xfc37df80;
            goto LAB_0011cfbe;
          }
        }
      }
      else {
        pbVar4 = (byte *)src + 1;
        uVar5 = 0x3f;
      }
    }
    else {
      pbVar4 = (byte *)src + 1;
LAB_0011cfbe:
      uVar5 = 0x3f;
      if (uVar6 != 0xffffffff) {
        if (uVar6 == 0) break;
        if (0xffff < uVar6) {
          if (uVar3 < 4) break;
          *dst = (ushort)(uVar6 + 0xf0000 >> 10) & 0x3ff | 0xd800;
          dst = dst + 1;
          uVar3 = len - 4;
          uVar6 = uVar6 & 0x3ff | 0xdc00;
        }
        uVar5 = (ushort)uVar6;
      }
    }
    *dst = uVar5;
    dst = dst + 1;
    src = (char *)pbVar4;
    len = uVar3;
    uVar2 = uVar3 - 2;
  }
  *dst = 0;
  return;
}

Assistant:

void FAudio_UTF8_To_UTF16(const char *src, uint16_t *dst, size_t len)
{
    len -= sizeof (uint16_t);   /* save room for null char. */
    while (len >= sizeof (uint16_t))
    {
        uint32_t cp = FAudio_UTF8_CodePoint(&src);
        if (cp == 0)
            break;
        else if (cp == UNICODE_BOGUS_CHAR_VALUE)
            cp = UNICODE_BOGUS_CHAR_CODEPOINT;

        if (cp > 0xFFFF)  /* encode as surrogate pair */
        {
            if (len < (sizeof (uint16_t) * 2))
                break;  /* not enough room for the pair, stop now. */

            cp -= 0x10000;  /* Make this a 20-bit value */

            *(dst++) = 0xD800 + ((cp >> 10) & 0x3FF);
            len -= sizeof (uint16_t);

            cp = 0xDC00 + (cp & 0x3FF);
        } /* if */

        *(dst++) = cp;
        len -= sizeof (uint16_t);
    } /* while */

    *dst = 0;
}